

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall fixedMeasurement_doubleOps_Test::TestBody(fixedMeasurement_doubleOps_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double dVar3;
  AssertHelper local_358;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_10;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_308;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_2d8 [8];
  fixed_measurement y;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_7;
  fixed_measurement fp4;
  Message local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_6;
  fixed_measurement fp3;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_5;
  fixed_measurement fp2;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_4;
  fixed_measurement fp1;
  AssertHelper local_1e8;
  Message local_1e0;
  measurement local_1d8;
  measurement local_1c8;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  measurement local_170;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  fixed_measurement f1;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  fixed_measurement f3;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  fixed_measurement f4;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  bool res;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  fixed_measurement freq2;
  Message local_58 [3];
  unit local_40;
  unit local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  fixed_measurement freq;
  fixedMeasurement_doubleOps_Test *this_local;
  
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar.message_,9.0,(unit *)&units::Hz);
  local_38 = units::fixed_measurement::units((fixed_measurement *)&gtest_ar.message_);
  local_40 = units::unit::operator/((unit *)&units::one,(unit *)&units::s);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_30,"freq.units()","one / s",&local_38,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&freq2.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&freq2.units_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&freq2.units_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  units::operator*((units *)&gtest_ar_1.message_,2.0,(fixed_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_1.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_80,"static_cast<float>(freq2.value())","18.0",(float)dVar3,18.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x16a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff70,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a8,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&f4.units_,(internal *)local_a8,(AssertionResult *)0x200651,"false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&f4.units_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  units::fixed_measurement::operator*((fixed_measurement *)&gtest_ar_2.message_,3.0);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_2.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_f8,"static_cast<float>(f4.value())","27.0",(float)dVar3,27.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&f3.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&f3.units_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&f3.units_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  units::fixed_measurement::operator/((fixed_measurement *)&gtest_ar_3.message_,3.0);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_3.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_128,"static_cast<float>(f3.value())","3.0",(float)dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&f1.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x172,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&f1.units_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&f1.units_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  units::operator/((units *)&gtest_ar__1.message_,9.0,(fixed_measurement *)&gtest_ar.message_);
  local_170 = units::operator*(1.0,(unit *)&units::s);
  local_159 = units::fixed_measurement::operator==
                        ((fixed_measurement *)&gtest_ar__1.message_,&local_170);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_158,
               (AssertionResult *)"f1 == (1.0 * s)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_1c8 = units::operator*(1.0,(unit *)&units::s);
  local_1d8 = units::fixed_measurement::operator_cast_to_measurement
                        ((fixed_measurement *)&gtest_ar__1.message_);
  local_1b1 = units::measurement::operator==(&local_1c8,&local_1d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fp1.units_,(internal *)local_1b0,(AssertionResult *)"(1.0 * s) == f1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&fp1.units_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  units::fixed_measurement::operator+((fixed_measurement *)&gtest_ar_4.message_,3.0);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_4.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_228,"static_cast<float>(fp1.value())","12.0",(float)dVar3,12.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp2.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp2.units_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp2.units_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  units::operator+((units *)&gtest_ar_5.message_,3.0,(fixed_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_5.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_258,"static_cast<float>(fp2.value())","12.0",(float)dVar3,12.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp3.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp3.units_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp3.units_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  units::fixed_measurement::operator-((fixed_measurement *)&gtest_ar_6.message_,3.0);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_6.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_288,"static_cast<float>(fp3.value())","6.0",(float)dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fp4.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fp4.units_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fp4.units_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  units::operator-((units *)&gtest_ar_7.message_,12.0,(fixed_measurement *)&gtest_ar.message_);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)&gtest_ar_7.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_2b8,"static_cast<float>(fp4.value())","3.0",(float)dVar3,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x182,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y.units_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y.units_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  join_0x00000000_0x00001200_ = units::operator*(2.0,(unit *)&units::m);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)local_2d8,(measurement *)&gtest_ar_8.message_);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)local_2d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2f8,"y.value()","2.0",dVar3,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  join_0x00000000_0x00001200_ = units::operator*(5.0,(unit *)&units::m);
  units::fixed_measurement::operator=
            ((fixed_measurement *)local_2d8,(measurement *)&gtest_ar_9.message_);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)local_2d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_328,"y.value()","5.0",dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  units::fixed_measurement::operator=((fixed_measurement *)local_2d8,7.0);
  dVar3 = units::fixed_measurement::value((fixed_measurement *)local_2d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_348,"y.value()","7.0",dVar3,7.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x189,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  return;
}

Assistant:

TEST(fixedMeasurement, doubleOps)
{
    fixed_measurement freq(9.0, Hz);
    EXPECT_EQ(freq.units(), one / s);
    auto freq2 = 2.0 * freq;
    EXPECT_FLOAT_EQ(static_cast<float>(freq2.value()), 18.0);
    bool res = std::is_same<decltype(freq), decltype(freq2)>::value;
    EXPECT_TRUE(res);

    auto f4 = freq * 3;
    EXPECT_FLOAT_EQ(static_cast<float>(f4.value()), 27.0);

    auto f3 = freq / 3;
    EXPECT_FLOAT_EQ(static_cast<float>(f3.value()), 3.0);

    auto f1 = 9.0 / freq;
    EXPECT_TRUE(f1 == (1.0 * s));
    EXPECT_TRUE((1.0 * s) == f1);

    auto fp1 = freq + 3.0;
    EXPECT_FLOAT_EQ(static_cast<float>(fp1.value()), 12.0);

    auto fp2 = 3.0 + freq;
    EXPECT_FLOAT_EQ(static_cast<float>(fp2.value()), 12.0);

    auto fp3 = freq - 3.0;
    EXPECT_FLOAT_EQ(static_cast<float>(fp3.value()), 6.0);

    auto fp4 = 12.0 - freq;
    EXPECT_FLOAT_EQ(static_cast<float>(fp4.value()), 3.0);

    fixed_measurement y(2.0 * m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
}